

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall xmrig::App::onSignal(App *this)

{
  int in_stack_0000000c;
  App *in_stack_00000010;
  
  onSignal(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

void xmrig::App::onSignal(int signum)
{
    switch (signum)
    {
    case SIGHUP:
        LOG_WARN("SIGHUP received, exiting");
        break;

    case SIGTERM:
        LOG_WARN("SIGTERM received, exiting");
        break;

    case SIGINT:
        LOG_WARN("SIGINT received, exiting");
        break;

    default:
        return;
    }

    close();
}